

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

void __thiscall kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,AssignStmt *stmt)

{
  int iVar1;
  undefined4 extraout_var;
  StmtException *this_00;
  initializer_list<kratos::IRNode_*> __l;
  AssignStmt *local_88;
  Var *local_80;
  Var *local_78;
  string local_70;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_50;
  undefined1 local_38 [8];
  shared_ptr<kratos::Port> port;
  
  if (stmt->left_->type_ == PortIO) {
    Var::as<kratos::Port>((Var *)local_38);
    if (*(int *)((long)local_38 + 0x270) == 0) {
      iVar1 = (*(stmt->left_->super_IRNode)._vptr_IRNode[0xd])();
      if (((Generator *)CONCAT44(extraout_var,iVar1) == this->generator_) &&
         (stmt->right_->type_ != ConstValue)) {
        this_00 = (StmtException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"Cannot drive a module\'s input from itself",
                   (allocator<char> *)
                   ((long)&port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 6));
        local_80 = stmt->left_;
        local_78 = stmt->right_;
        __l._M_len = 3;
        __l._M_array = (iterator)&local_88;
        local_88 = stmt;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  (&local_50,__l,
                   (allocator_type *)
                   ((long)&port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
        StmtException::StmtException(this_00,&local_70,&local_50);
        __cxa_throw(this_00,&StmtException::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&port);
  }
  Stream::operator<<(&this->stream_,stmt);
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(AssignStmt* stmt) {
    if (stmt->left()->type() == VarType::PortIO) {
        auto port = stmt->left()->as<Port>();
        if (port->port_direction() == PortDirection::In &&
            stmt->left()->generator() == generator_ &&
            stmt->right()->type() != VarType::ConstValue) {
            throw StmtException("Cannot drive a module's input from itself",
                                {stmt, stmt->left(), stmt->right()});
        }
    }
    stream_ << stmt;
}